

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O2

void __thiscall
gl4cts::EnhancedLayouts::VaryingArrayLocationsTest::prepareShaderStage
          (VaryingArrayLocationsTest *this,STAGES stage,Type *type,
          ProgramInterface *program_interface,VaryingPassthrough *varying_passthrough)

{
  GLchar *text;
  GLchar *text_00;
  pointer puVar1;
  VaryingPassthrough *this_00;
  GLint expected_location;
  GLuint offset;
  GLint expected_location_00;
  ShaderInterface *this_01;
  Variable *pVVar2;
  Variable *out;
  char *pcVar3;
  char *qualifiers;
  char *qualifiers_00;
  size_t position;
  Variable *local_e8;
  Variable *local_e0;
  VaryingPassthrough *local_d8;
  string last_out_name;
  string last_in_name;
  string first_out_name;
  string local_70;
  string first_in_name;
  
  local_d8 = varying_passthrough;
  expected_location = TestBase::getLastInputLocation((TestBase *)this,stage,type,1);
  position = 0;
  text = Utils::ProgramInterface::GetStagePrefix::lut[stage][0];
  text_00 = Utils::ProgramInterface::GetStagePrefix::lut[stage][1];
  this_01 = Utils::ProgramInterface::GetShaderInterface(program_interface,stage);
  offset = Utils::Type::GetSize(type);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&first_in_name,"PREFIXfirst",(allocator<char> *)&first_out_name);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&first_out_name,"PREFIXfirst",(allocator<char> *)&last_in_name);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&last_in_name,"PREFIXlast",(allocator<char> *)&last_out_name);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&last_out_name,"PREFIXlast",(allocator<char> *)&local_70);
  Utils::replaceToken("PREFIX",&position,text,&first_in_name);
  position = 0;
  Utils::replaceToken("PREFIX",&position,text_00,&first_out_name);
  position = 0;
  Utils::replaceToken("PREFIX",&position,text,&last_in_name);
  position = 0;
  Utils::replaceToken("PREFIX",&position,text_00,&last_out_name);
  pcVar3 = "layout (location = first_input_location)";
  if (stage == FRAGMENT) {
    pcVar3 = "layout (location = first_input_location) flat";
  }
  qualifiers_00 = "layout (location = last_output_location)";
  if (stage == GEOMETRY) {
    qualifiers_00 = "layout (location = last_output_location)  flat";
  }
  qualifiers = "layout (location = first_output_location)";
  if (stage == GEOMETRY) {
    qualifiers = "layout (location = first_output_location) flat";
  }
  puVar1 = (this->super_VaryingLocationsTest).m_first_data.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_e0 = Utils::ShaderInterface::Input<void>
                       (this_01,first_in_name._M_dataplus._M_p,pcVar3,0,0,type,'\0',1,0,0,puVar1,
                        (long)(this->super_VaryingLocationsTest).m_first_data.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish - (long)puVar1);
  pcVar3 = "layout (location = last_input_location)";
  if (stage == FRAGMENT) {
    pcVar3 = "layout (location = last_input_location)  flat";
  }
  puVar1 = (this->super_VaryingLocationsTest).m_last_data.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  pVVar2 = Utils::ShaderInterface::Input<void>
                     (this_01,last_in_name._M_dataplus._M_p,pcVar3,0,expected_location,type,'\0',1,0
                      ,offset,puVar1,
                      (long)(this->super_VaryingLocationsTest).m_last_data.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (long)puVar1);
  if (stage == FRAGMENT) {
    VaryingLocationsTest::prepareGlobals_abi_cxx11_
              (&local_70,(VaryingLocationsTest *)last_in_name._M_dataplus._M_p,expected_location,0);
    std::__cxx11::string::operator=((string *)this_01,(string *)&local_70);
    std::__cxx11::string::~string((string *)&local_70);
  }
  else {
    local_e8 = pVVar2;
    expected_location_00 = TestBase::getLastOutputLocation((TestBase *)this,stage,type,1);
    puVar1 = (this->super_VaryingLocationsTest).m_first_data.
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    pVVar2 = Utils::ShaderInterface::Output<void>
                       (this_01,first_out_name._M_dataplus._M_p,qualifiers,0,0,type,'\0',1,0,0,
                        puVar1,(long)(this->super_VaryingLocationsTest).m_first_data.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)puVar1);
    puVar1 = (this->super_VaryingLocationsTest).m_last_data.
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    out = Utils::ShaderInterface::Output<void>
                    (this_01,last_out_name._M_dataplus._M_p,qualifiers_00,0,expected_location_00,
                     type,'\0',1,0,0,puVar1,
                     (long)(this->super_VaryingLocationsTest).m_last_data.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_finish - (long)puVar1);
    this_00 = local_d8;
    VaryingLocationsTest::prepareGlobals_abi_cxx11_
              (&local_70,(VaryingLocationsTest *)last_out_name._M_dataplus._M_p,expected_location,
               expected_location_00);
    std::__cxx11::string::operator=((string *)this_01,(string *)&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    Utils::VaryingPassthrough::Add(this_00,stage,local_e0,pVVar2);
    Utils::VaryingPassthrough::Add(this_00,stage,local_e8,out);
  }
  std::__cxx11::string::~string((string *)&last_out_name);
  std::__cxx11::string::~string((string *)&last_in_name);
  std::__cxx11::string::~string((string *)&first_out_name);
  std::__cxx11::string::~string((string *)&first_in_name);
  return;
}

Assistant:

void VaryingArrayLocationsTest::prepareShaderStage(Utils::Shader::STAGES stage, const Utils::Type& type,
												   Utils::ProgramInterface&   program_interface,
												   Utils::VaryingPassthrough& varying_passthrough)
{
	const GLuint array_length  = 1u;
	const GLuint first_in_loc  = 0;
	const GLuint first_out_loc = 0;
	const GLuint last_in_loc   = getLastInputLocation(stage, type, array_length);
	size_t		 position	  = 0;

	const GLchar* prefix_in = Utils::ProgramInterface::GetStagePrefix(stage, Utils::Variable::VARYING_INPUT);

	const GLchar* prefix_out = Utils::ProgramInterface::GetStagePrefix(stage, Utils::Variable::VARYING_OUTPUT);

	const GLchar* qual_first_in  = "layout (location = first_input_location)";
	const GLchar* qual_first_out = "layout (location = first_output_location)";
	const GLchar* qual_last_in   = "layout (location = last_input_location)";
	const GLchar* qual_last_out  = "layout (location = last_output_location)";

	Utils::ShaderInterface& si		  = program_interface.GetShaderInterface(stage);
	const GLuint			type_size = type.GetSize();

	std::string first_in_name  = "PREFIXfirst";
	std::string first_out_name = "PREFIXfirst";
	std::string last_in_name   = "PREFIXlast";
	std::string last_out_name  = "PREFIXlast";

	Utils::replaceToken("PREFIX", position, prefix_in, first_in_name);
	position = 0;
	Utils::replaceToken("PREFIX", position, prefix_out, first_out_name);
	position = 0;
	Utils::replaceToken("PREFIX", position, prefix_in, last_in_name);
	position = 0;
	Utils::replaceToken("PREFIX", position, prefix_out, last_out_name);

	if (Utils::Shader::FRAGMENT == stage)
	{
		qual_first_in = "layout (location = first_input_location) flat";
		qual_last_in  = "layout (location = last_input_location)  flat";
	}
	if (Utils::Shader::GEOMETRY == stage)
	{
		qual_first_out = "layout (location = first_output_location) flat";
		qual_last_out  = "layout (location = last_output_location)  flat";
	}

	Utils::Variable* first_in =
		si.Input(first_in_name.c_str(), qual_first_in /* qualifiers */, 0 /* expected_componenet */,
				 first_in_loc /* expected_location */, type /* type */, GL_FALSE /* normalized */,
				 array_length /* n_array_elements */, 0u /* stride */, 0u /* offset */,
				 (GLvoid*)&m_first_data[0] /* data */, m_first_data.size() /* data_size */);

	Utils::Variable* last_in =
		si.Input(last_in_name.c_str(), qual_last_in /* qualifiers */, 0 /* expected_componenet */,
				 last_in_loc /* expected_location */, type /* type */, GL_FALSE /* normalized */,
				 array_length /* n_array_elements */, 0u /* stride */, type_size /* offset */,
				 (GLvoid*)&m_last_data[0] /* data */, m_last_data.size() /* data_size */);

	if (Utils::Shader::FRAGMENT != stage)
	{
		const GLuint last_out_loc = getLastOutputLocation(stage, type, array_length);

		Utils::Variable* first_out =
			si.Output(first_out_name.c_str(), qual_first_out /* qualifiers */, 0 /* expected_componenet */,
					  first_out_loc /* expected_location */, type /* type */, GL_FALSE /* normalized */,
					  array_length /* n_array_elements */, 0u /* stride */, 0u /* offset */,
					  (GLvoid*)&m_first_data[0] /* data */, m_first_data.size() /* data_size */);

		Utils::Variable* last_out =
			si.Output(last_out_name.c_str(), qual_last_out /* qualifiers */, 0 /* expected_componenet */,
					  last_out_loc /* expected_location */, type /* type */, GL_FALSE /* normalized */,
					  array_length /* n_array_elements */, 0u /* stride */, 0u /* offset */,
					  (GLvoid*)&m_last_data[0] /* data */, m_last_data.size() /* data_size */);

		si.m_globals = prepareGlobals(last_in_loc, last_out_loc);

		varying_passthrough.Add(stage, first_in, first_out);
		varying_passthrough.Add(stage, last_in, last_out);
	}
	else
	{
		/* No outputs for fragment shader, so last_output_location can be 0 */
		si.m_globals = prepareGlobals(last_in_loc, 0);
	}
}